

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall
Hpipe::Instruction::apply_rec
          (Instruction *this,function<void_(Hpipe::Instruction_*)> *f,bool subgraphs)

{
  Instruction *pIVar1;
  bool bVar2;
  function<void_(Hpipe::Instruction_*)> local_60;
  reference local_40;
  Transition *t;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::Transition> *__range1;
  bool subgraphs_local;
  function<void_(Hpipe::Instruction_*)> *f_local;
  Instruction *this_local;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    std::function<void_(Hpipe::Instruction_*)>::operator()(f,this);
    __end1 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::begin
                       (&(this->next).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    t = (Transition *)
        std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::end
                  (&(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>
                  );
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                                       *)&t), bVar2) {
      local_40 = __gnu_cxx::
                 __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
                 ::operator*(&__end1);
      if (local_40->inst != (Instruction *)0x0) {
        pIVar1 = local_40->inst;
        std::function<void_(Hpipe::Instruction_*)>::function(&local_60,f);
        (*pIVar1->_vptr_Instruction[6])(pIVar1,&local_60,(ulong)(subgraphs & 1));
        std::function<void_(Hpipe::Instruction_*)>::~function(&local_60);
      }
      __gnu_cxx::
      __normal_iterator<Hpipe::Transition_*,_std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Instruction::apply_rec( std::function<void (Instruction *)> f, bool subgraphs ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    f( this );

    for( Transition &t : next )
        if ( t.inst )
            t.inst->apply_rec( f, subgraphs );
}